

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O3

int nn_sock_add_ep(nn_sock *self,nn_transport *transport,int bind,char *addr)

{
  int iVar1;
  nn_ep *self_00;
  nn_list_item *it;
  
  nn_ctx_enter(&self->ctx);
  self_00 = (nn_ep *)nn_alloc_(0x118);
  iVar1 = nn_ep_init(self_00,1,self,self->eid,transport,bind,addr);
  if (iVar1 < 0) {
    nn_free(self_00);
  }
  else {
    nn_ep_start(self_00);
    iVar1 = self->eid;
    self->eid = iVar1 + 1;
    it = nn_list_end(&self->eps);
    nn_list_insert(&self->eps,&self_00->item,it);
  }
  nn_ctx_leave(&self->ctx);
  return iVar1;
}

Assistant:

int nn_sock_add_ep (struct nn_sock *self, struct nn_transport *transport,
    int bind, const char *addr)
{
    int rc;
    struct nn_ep *ep;
    int eid;

    nn_ctx_enter (&self->ctx);

    /*  Instantiate the endpoint. */
    ep = nn_alloc (sizeof (struct nn_ep), "endpoint");
    rc = nn_ep_init (ep, NN_SOCK_SRC_EP, self, self->eid, transport,
        bind, addr);
    if (nn_slow (rc < 0)) {
        nn_free (ep);
        nn_ctx_leave (&self->ctx);
        return rc;
    }
    nn_ep_start (ep);

    /*  Increase the endpoint ID for the next endpoint. */
    eid = self->eid;
    ++self->eid;

    /*  Add it to the list of active endpoints. */
    nn_list_insert (&self->eps, &ep->item, nn_list_end (&self->eps));

    nn_ctx_leave (&self->ctx);

    return eid;
}